

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::LibraryMapSyntax::setChild(LibraryMapSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  undefined4 uVar2;
  SyntaxNode *pSVar3;
  Token TVar4;
  
  if (index == 0) {
    pSVar3 = TokenOrSyntax::node(&child);
    uVar2 = *(undefined4 *)&pSVar3->field_0x4;
    pSVar1 = pSVar3->parent;
    (this->members).super_SyntaxListBase.super_SyntaxNode.kind = pSVar3->kind;
    *(undefined4 *)&(this->members).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar2;
    (this->members).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
    (this->members).super_SyntaxListBase.super_SyntaxNode.previewNode = pSVar3->previewNode;
    (this->members).super_SyntaxListBase.childCount = *(size_t *)(pSVar3 + 1);
    pSVar1 = pSVar3[1].previewNode;
    (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_ptr =
         (pointer)pSVar3[1].parent;
    (this->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>._M_extent.
    _M_extent_value = (size_t)pSVar1;
  }
  else {
    TVar4 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->endOfFile).kind = TVar4.kind;
    (this->endOfFile).field_0x2 = TVar4._2_1_;
    (this->endOfFile).numFlags = (NumericTokenFlags)TVar4.numFlags.raw;
    (this->endOfFile).rawLen = TVar4.rawLen;
    (this->endOfFile).info = TVar4.info;
  }
  return;
}

Assistant:

void LibraryMapSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: members = child.node()->as<SyntaxList<MemberSyntax>>(); return;
        case 1: endOfFile = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}